

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

bool costScaleOk(vector<double,_std::allocator<double>_> *cost,HighsInt cost_scale,
                double infinite_cost)

{
  double dVar1;
  pointer pdVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  double dVar6;
  
  if (cost_scale == 0) {
    return true;
  }
  dVar6 = ldexp(1.0,cost_scale);
  pdVar2 = (cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
  bVar3 = (int)uVar5 < 1;
  if (0 < (int)uVar5) {
    uVar4 = 0;
    do {
      dVar1 = pdVar2[uVar4];
      if (((ulong)ABS(dVar1) < 0x7ff0000000000000) && (infinite_cost < ABS(dVar1 * dVar6))) {
        return false;
      }
      uVar4 = uVar4 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar4);
    bVar3 = (uVar5 & 0x7fffffff) <= uVar4;
  }
  return bVar3;
}

Assistant:

bool costScaleOk(const vector<double>& cost, const HighsInt cost_scale,
                 const double infinite_cost) {
  if (!cost_scale) return true;
  double cost_scale_value = std::pow(2, cost_scale);
  for (HighsInt iCol = 0; iCol < HighsInt(cost.size()); iCol++)
    if (std::abs(cost[iCol]) < kHighsInf &&
        std::abs(cost[iCol] * cost_scale_value) > infinite_cost)
      return false;
  return true;
}